

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_initkey(BlowfishContext *ctx)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)ctx->P + lVar1) = *(undefined4 *)((long)parray + lVar1);
  }
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)ctx->S0 + lVar1) = *(undefined4 *)((long)sbox0 + lVar1);
    *(undefined4 *)((long)ctx->S1 + lVar1) = *(undefined4 *)((long)sbox1 + lVar1);
    *(undefined4 *)((long)ctx->S2 + lVar1) = *(undefined4 *)((long)sbox2 + lVar1);
    *(undefined4 *)((long)ctx->S3 + lVar1) = *(undefined4 *)((long)sbox3 + lVar1);
  }
  return;
}

Assistant:

void blowfish_initkey(BlowfishContext *ctx)
{
    int i;

    for (i = 0; i < 18; i++) {
        ctx->P[i] = parray[i];
    }

    for (i = 0; i < 256; i++) {
        ctx->S0[i] = sbox0[i];
        ctx->S1[i] = sbox1[i];
        ctx->S2[i] = sbox2[i];
        ctx->S3[i] = sbox3[i];
    }
}